

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::finishSymmetryDetection
          (HighsMipSolverData *this,TaskGroup *taskGroup,
          unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
          *symData)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  pointer pSVar4;
  undefined8 uVar5;
  size_type sVar6;
  ulong uVar7;
  TaskGroup *in_RSI;
  long *in_RDI;
  HighsCliqueTable *in_stack_00000048;
  HighsOrbitopeMatrix *in_stack_00000050;
  HighsOrbitopeMatrix *orbitope;
  iterator __end1;
  iterator __begin1;
  vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *__range1;
  string symmetry_time;
  HighsDomain *in_stack_000000e0;
  HighsSymmetries *in_stack_000000e8;
  pointer in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  __normal_iterator<HighsOrbitopeMatrix_*,_std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>_>
  local_60;
  long *local_58;
  byte local_3a;
  allocator local_39;
  string local_38 [56];
  
  ::highs::parallel::TaskGroup::sync(in_RSI);
  std::
  unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
  ::operator->((unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
                *)0x623776);
  HighsSymmetries::operator=
            ((HighsSymmetries *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (HighsSymmetries *)in_stack_ffffffffffffff38);
  local_3a = 0;
  if ((*(byte *)(*(long *)(*in_RDI + 8) + 0x1da) & 1) == 0) {
    pSVar4 = std::
             unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
             ::operator->((unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
                           *)0x6237f3);
    highsFormatToString_abi_cxx11_((char *)pSVar4->detectionTime,local_38," %.1fs");
  }
  else {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string(local_38,"",&local_39);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  lVar2 = *(long *)(*in_RDI + 8);
  uVar5 = std::__cxx11::string::c_str();
  highsLogUser((HighsLogOptions *)(lVar2 + 0x380),kInfo,"\nSymmetry detection completed in%s\n",
               uVar5);
  if (*(int *)((long)in_RDI + 0x660c) == 0) {
    *(undefined1 *)(in_RDI + 0xc83) = 0;
    highsLogUser((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kInfo,"No symmetry present\n\n"
                );
  }
  else {
    sVar6 = std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::size
                      ((vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *)
                       (in_RDI + 0xcb9));
    if (sVar6 == 0) {
      highsLogUser((HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380),kInfo,
                   "Found %d generator(s)\n\n",(ulong)*(uint *)((long)in_RDI + 0x660c));
    }
    else if ((int)in_RDI[0xcc1] == 0) {
      in_stack_ffffffffffffff38 = (pointer)(*(long *)(*in_RDI + 8) + 0x380);
      sVar6 = std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::size
                        ((vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *)
                         (in_RDI + 0xcb9));
      in_stack_ffffffffffffff44 = (uint)sVar6;
      uVar7 = HighsHashTable<int,_int>::size((HighsHashTable<int,_int> *)(in_RDI + 0xcbc));
      highsLogUser((HighsLogOptions *)in_stack_ffffffffffffff38,kInfo,
                   "Found %d full orbitope(s) acting on %d columns\n\n",
                   (ulong)in_stack_ffffffffffffff44,uVar7 & 0xffffffff);
    }
    else {
      lVar2 = *(long *)(*in_RDI + 8);
      uVar1 = *(uint *)(in_RDI + 0xcc1);
      sVar6 = std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::size
                        ((vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *)
                         (in_RDI + 0xcb9));
      uVar7 = HighsHashTable<int,_int>::size((HighsHashTable<int,_int> *)(in_RDI + 0xcbc));
      highsLogUser((HighsLogOptions *)(lVar2 + 0x380),kInfo,
                   "Found %d generator(s) and %d full orbitope(s) acting on %d columns\n\n",
                   (ulong)uVar1,sVar6 & 0xffffffff,uVar7 & 0xffffffff);
    }
  }
  std::
  unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
  ::reset((unique_ptr<HighsMipSolverData::SymmetryDetectionData,_std::default_delete<HighsMipSolverData::SymmetryDetectionData>_>
           *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
         );
  local_58 = in_RDI + 0xcb9;
  local_60._M_current =
       (HighsOrbitopeMatrix *)
       std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::begin
                 ((vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *)
                  in_stack_ffffffffffffff38);
  std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>::end
            ((vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_> *)
             in_stack_ffffffffffffff38);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<HighsOrbitopeMatrix_*,_std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (__normal_iterator<HighsOrbitopeMatrix_*,_std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>_>
                             *)in_stack_ffffffffffffff38), bVar3) {
    __gnu_cxx::
    __normal_iterator<HighsOrbitopeMatrix_*,_std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>_>
    ::operator*(&local_60);
    HighsOrbitopeMatrix::determineOrbitopeType(in_stack_00000050,in_stack_00000048);
    __gnu_cxx::
    __normal_iterator<HighsOrbitopeMatrix_*,_std::vector<HighsOrbitopeMatrix,_std::allocator<HighsOrbitopeMatrix>_>_>
    ::operator++(&local_60);
  }
  if ((int)in_RDI[0xcc1] != 0) {
    HighsSymmetries::computeStabilizerOrbits(in_stack_000000e8,in_stack_000000e0);
    std::shared_ptr<const_StabilizerOrbits>::operator=
              ((shared_ptr<const_StabilizerOrbits> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (shared_ptr<const_StabilizerOrbits> *)in_stack_ffffffffffffff38);
    std::shared_ptr<const_StabilizerOrbits>::~shared_ptr
              ((shared_ptr<const_StabilizerOrbits> *)0x623b24);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void HighsMipSolverData::finishSymmetryDetection(
    const highs::parallel::TaskGroup& taskGroup,
    std::unique_ptr<SymmetryDetectionData>& symData) {
  taskGroup.sync();

  symmetries = std::move(symData->symmetries);
  std::string symmetry_time =
      mipsolver.options_mip_->timeless_log
          ? ""
          : highsFormatToString(" %.1fs", symData->detectionTime);
  highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
               "\nSymmetry detection completed in%s\n", symmetry_time.c_str());

  if (symmetries.numGenerators == 0) {
    detectSymmetries = false;
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "No symmetry present\n\n");
  } else if (symmetries.orbitopes.size() == 0) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Found %d generator(s)\n\n", int(symmetries.numGenerators));

  } else {
    if (symmetries.numPerms != 0) {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "Found %d generator(s) and %d full orbitope(s) acting on %d "
                   "columns\n\n",
                   int(symmetries.numPerms), int(symmetries.orbitopes.size()),
                   int(symmetries.columnToOrbitope.size()));
    } else {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "Found %d full orbitope(s) acting on %d columns\n\n",
                   int(symmetries.orbitopes.size()),
                   int(symmetries.columnToOrbitope.size()));
    }
  }
  symData.reset();

  for (HighsOrbitopeMatrix& orbitope : symmetries.orbitopes)
    orbitope.determineOrbitopeType(cliquetable);

  if (symmetries.numPerms != 0)
    globalOrbits = symmetries.computeStabilizerOrbits(domain);
}